

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

bool __thiscall google::anon_unknown_1::FlagValue::ParseFrom(FlagValue *this,char *value)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  ulonglong uVar7;
  size_t sVar8;
  ulonglong uVar9;
  long lVar10;
  char *end;
  char *local_40;
  double local_38;
  
  cVar1 = this->type_;
  if (cVar1 == '\x06') {
    pvVar2 = this->value_buffer_;
    pcVar3 = *(char **)((long)pvVar2 + 8);
    strlen(value);
    std::__cxx11::string::_M_replace((ulong)pvVar2,0,pcVar3,(ulong)value);
LAB_001936d1:
    bVar4 = true;
  }
  else {
    if (cVar1 == '\0') {
      lVar10 = 0;
      do {
        iVar5 = strcasecmp(value,(char *)((long)&DAT_001b2c4c +
                                         (long)*(int *)((long)&DAT_001b2c4c + lVar10)));
        if (iVar5 == 0) {
          *(undefined1 *)this->value_buffer_ = 1;
          goto LAB_001936d1;
        }
        iVar5 = strcasecmp(value,(char *)((long)&DAT_001b2c60 +
                                         (long)*(int *)((long)&DAT_001b2c60 + lVar10)));
        if (iVar5 == 0) {
          *(undefined1 *)this->value_buffer_ = 0;
          goto LAB_001936d1;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x14);
    }
    else if (*value != '\0') {
      iVar5 = 10;
      if (*value == '0') {
        iVar5 = 10;
        if ((value[1] + 0xa8U & 0xdf) == 0) {
          iVar5 = 0x10;
        }
      }
      piVar6 = __errno_location();
      *piVar6 = 0;
      switch(cVar1) {
      case '\x01':
        uVar7 = strtoll(value,&local_40,iVar5);
        if (*piVar6 == 0) {
          sVar8 = strlen(value);
          if (local_40 != value + sVar8) {
            return false;
          }
          uVar9 = uVar7 + 0x80000000;
LAB_001937d4:
          if (uVar9 >> 0x20 != 0) {
            return false;
          }
          *(int *)this->value_buffer_ = (int)uVar7;
          goto LAB_001936d1;
        }
        break;
      case '\x02':
        for (; *value == ' '; value = value + 1) {
        }
        if ((*value != '-') && (uVar9 = strtoull(value,&local_40,iVar5), *piVar6 == 0)) {
          sVar8 = strlen(value);
          uVar7 = uVar9;
          if (value + sVar8 != local_40) {
            return false;
          }
          goto LAB_001937d4;
        }
        break;
      case '\x03':
        uVar9 = strtoll(value,&local_40,iVar5);
        if ((*piVar6 == 0) && (sVar8 = strlen(value), local_40 == value + sVar8)) {
LAB_0019377e:
          *(ulonglong *)this->value_buffer_ = uVar9;
          goto LAB_001936d1;
        }
        break;
      case '\x04':
        for (; *value == ' '; value = value + 1) {
        }
        if (((*value != '-') && (uVar9 = strtoull(value,&local_40,iVar5), *piVar6 == 0)) &&
           (sVar8 = strlen(value), value + sVar8 == local_40)) goto LAB_0019377e;
        break;
      case '\x05':
        local_38 = strtod(value,&local_40);
        if ((*piVar6 == 0) && (sVar8 = strlen(value), local_40 == value + sVar8)) {
          *(double *)this->value_buffer_ = local_38;
          goto LAB_001936d1;
        }
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                      ,0x158,
                      "bool google::(anonymous namespace)::FlagValue::ParseFrom(const char *)");
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool FlagValue::ParseFrom(const char* value) {
  if (type_ == FV_BOOL) {
    const char* kTrue[] = { "1", "t", "true", "y", "yes" };
    const char* kFalse[] = { "0", "f", "false", "n", "no" };
    COMPILE_ASSERT(sizeof(kTrue) == sizeof(kFalse), true_false_equal);
    for (size_t i = 0; i < sizeof(kTrue)/sizeof(*kTrue); ++i) {
      if (strcasecmp(value, kTrue[i]) == 0) {
        SET_VALUE_AS(bool, true);
        return true;
      } else if (strcasecmp(value, kFalse[i]) == 0) {
        SET_VALUE_AS(bool, false);
        return true;
      }
    }
    return false;   // didn't match a legal input

  } else if (type_ == FV_STRING) {
    SET_VALUE_AS(string, value);
    return true;
  }

  // OK, it's likely to be numeric, and we'll be using a strtoXXX method.
  if (value[0] == '\0')   // empty-string is only allowed for string type.
    return false;
  char* end;
  // Leading 0x puts us in base 16.  But leading 0 does not put us in base 8!
  // It caused too many bugs when we had that behavior.
  int base = 10;    // by default
  if (value[0] == '0' && (value[1] == 'x' || value[1] == 'X'))
    base = 16;
  errno = 0;

  switch (type_) {
    case FV_INT32: {
      const int64 r = strto64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      if (static_cast<int32>(r) != r)  // worked, but number out of range
        return false;
      SET_VALUE_AS(int32, static_cast<int32>(r));
      return true;
    }
    case FV_UINT32: {
      while (*value == ' ') value++;
      if (*value == '-') return false;  // negative number
      const uint64 r = strtou64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
        if (static_cast<uint32>(r) != r)  // worked, but number out of range
        return false;
      SET_VALUE_AS(uint32, static_cast<uint32>(r));
      return true;
    }
    case FV_INT64: {
      const int64 r = strto64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(int64, r);
      return true;
    }
    case FV_UINT64: {
      while (*value == ' ') value++;
      if (*value == '-') return false;  // negative number
      const uint64 r = strtou64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(uint64, r);
      return true;
    }
    case FV_DOUBLE: {
      const double r = strtod(value, &end);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(double, r);
      return true;
    }
    default: {
      assert(false);  // unknown type
      return false;
    }
  }
}